

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorShader.cpp
# Opt level: O3

DecoratorDataHandle __thiscall
Rml::DecoratorShader::GenerateElementData(DecoratorShader *this,Element *element,BoxArea paint_area)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined4 uVar6;
  RenderManager *mesh_00;
  ComputedValues *pCVar7;
  pointer pVVar8;
  PoolNode *pPVar9;
  long lVar10;
  Variant *this_00;
  undefined1 auVar11 [16];
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>
  init;
  CompiledShader shader;
  Mesh mesh;
  RenderBox render_box;
  allocator_type local_1a2;
  key_compare local_1a1;
  undefined1 local_1a0 [16];
  undefined1 local_190 [40];
  undefined1 local_168 [32];
  Vector2f local_148;
  Vector2Type VStack_140;
  flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
  local_130;
  undefined1 local_118 [40];
  pointer piStack_f0;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
  local_d0;
  Variant local_88;
  RenderBox local_60;
  
  mesh_00 = Element::GetRenderManager(element);
  if (mesh_00 == (RenderManager *)0x0) {
    pPVar9 = (PoolNode *)0x0;
  }
  else {
    Element::GetRenderBox(&local_60,element,paint_area,0);
    local_148 = local_60.fill_size;
    VStack_140.x = 0;
    VStack_140.y = 0;
    local_168._0_8_ = (pointer)(local_168 + 0x10);
    ::std::__cxx11::string::_M_construct<char_const*>((string *)local_168,"shader","");
    local_190._0_8_ = (RenderManager *)0x2d;
    Variant::Set((Variant *)local_190,&this->value);
    ::std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
    ::pair<const_char_(&)[6],_Rml::Variant,_true>
              ((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
                *)local_118,(char (*) [6])0x2d0239,(Variant *)local_190);
    local_88.type = NONE;
    Variant::Set(&local_88,local_148);
    ::std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>
    ::pair<const_char_(&)[11],_Rml::Variant,_true>(&local_d0,(char (*) [11])"dimensions",&local_88);
    init._M_len = 2;
    init._M_array = (iterator)local_118;
    itlib::
    flat_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant,_itlib::fmimpl::less,_std::vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>_>
    ::flat_map(&local_130,init,&local_1a1,&local_1a2);
    RenderManager::CompileShader
              ((RenderManager *)local_1a0,(String *)mesh_00,(Dictionary *)local_168);
    ::std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_Rml::Variant>_>_>
    ::~vector(&local_130.m_container);
    lVar10 = -0x90;
    this_00 = &local_d0.second;
    do {
      Variant::~Variant(this_00);
      if ((long *)(this_00[-1].data + 0x10) != *(long **)this_00[-1].data) {
        operator_delete(*(long **)this_00[-1].data,*(long *)(this_00[-1].data + 0x10) + 1);
      }
      this_00 = (Variant *)this_00[-2].data;
      lVar10 = lVar10 + 0x48;
    } while (lVar10 != 0);
    Variant::~Variant(&local_88);
    Variant::~Variant((Variant *)local_190);
    if ((pointer)local_168._0_8_ != (pointer)(local_168 + 0x10)) {
      operator_delete((void *)local_168._0_8_,(ulong)(local_168._16_8_ + 1));
    }
    if ((pointer)local_1a0._8_8_ == (pointer)0x0) {
      pPVar9 = (PoolNode *)0x0;
    }
    else {
      local_118._32_8_ = (pointer)0x0;
      piStack_f0 = (pointer)0x0;
      local_118._16_8_ = 0;
      local_118._24_8_ = (void *)0x0;
      local_118._0_8_ = (pointer)0x0;
      local_118._8_8_ = (pointer)0x0;
      pCVar7 = Element::GetComputedValues(element);
      MeshUtilities::GenerateBackground
                ((Mesh *)local_118,&local_60,
                 (ColourbPremultiplied)
                 (((int)((pCVar7->inherited).opacity * 255.0) & 0xffU) * 0x1010101));
      auVar2._8_4_ = VStack_140.x;
      auVar2._12_4_ = VStack_140.y;
      auVar2._0_4_ = local_148.x;
      auVar2._4_4_ = local_148.y;
      for (pVVar8 = (pointer)local_118._0_8_; pVVar8 != (pointer)local_118._8_8_;
          pVVar8 = pVVar8 + 1) {
        auVar11._0_4_ = (pVVar8->position).x - local_60.border_widths._M_elems[3];
        auVar11._4_4_ = (pVVar8->position).y - local_60.border_widths._M_elems[0];
        auVar11._8_4_ = 0.0 - local_60.border_radius._M_elems[1];
        auVar11._12_4_ = 0.0 - local_60.border_radius._M_elems[2];
        auVar11 = divps(auVar11,auVar2);
        pVVar8->tex_coord = auVar11._0_8_;
      }
      GetShaderElementDataPool();
      RenderManager::MakeGeometry((RenderManager *)local_190,(Mesh *)mesh_00);
      pPVar9 = GetShaderElementDataPool::gradient_element_data_pool.first_free_node;
      if ((GetShaderElementDataPool::gradient_element_data_pool.first_free_node == (PoolNode *)0x0)
         && ((GetShaderElementDataPool::gradient_element_data_pool.grow != true ||
             (Pool<Rml::ShaderElementData>::CreateChunk
                        (&GetShaderElementDataPool::gradient_element_data_pool),
             pPVar9 = GetShaderElementDataPool::gradient_element_data_pool.first_free_node,
             GetShaderElementDataPool::gradient_element_data_pool.first_free_node == (PoolNode *)0x0
             )))) {
        pPVar9 = (PoolNode *)0x0;
      }
      else {
        uVar6 = local_190._8_4_;
        uVar5 = local_190._0_8_;
        uVar4 = local_1a0._8_8_;
        uVar3 = local_1a0._0_8_;
        iVar1 = GetShaderElementDataPool::gradient_element_data_pool.num_allocated_objects + 1;
        if (GetShaderElementDataPool::gradient_element_data_pool.max_num_allocated_objects <=
            GetShaderElementDataPool::gradient_element_data_pool.num_allocated_objects) {
          GetShaderElementDataPool::gradient_element_data_pool.max_num_allocated_objects = iVar1;
        }
        GetShaderElementDataPool::gradient_element_data_pool.first_free_node = pPVar9->next;
        GetShaderElementDataPool::gradient_element_data_pool.num_allocated_objects = iVar1;
        if (GetShaderElementDataPool::gradient_element_data_pool.first_free_node != (PoolNode *)0x0)
        {
          (GetShaderElementDataPool::gradient_element_data_pool.first_free_node)->previous =
               (PoolNode *)0x0;
        }
        pPVar9->previous = (PoolNode *)0x0;
        if (GetShaderElementDataPool::gradient_element_data_pool.first_allocated_node !=
            (PoolNode *)0x0) {
          (GetShaderElementDataPool::gradient_element_data_pool.first_allocated_node)->previous =
               pPVar9;
        }
        pPVar9->next = GetShaderElementDataPool::gradient_element_data_pool.first_allocated_node;
        GetShaderElementDataPool::gradient_element_data_pool.first_allocated_node = pPVar9;
        pPVar9->object[0] = '\0';
        pPVar9->object[1] = '\0';
        pPVar9->object[2] = '\0';
        pPVar9->object[3] = '\0';
        pPVar9->object[4] = '\0';
        pPVar9->object[5] = '\0';
        pPVar9->object[6] = '\0';
        pPVar9->object[7] = '\0';
        pPVar9->object[8] = 0xff;
        pPVar9->object[9] = 0xff;
        pPVar9->object[10] = 0xff;
        pPVar9->object[0xb] = 0xff;
        local_190._0_8_ = (RenderManager *)0x0;
        *(undefined8 *)pPVar9->object = uVar5;
        local_190._8_4_ = Invalid;
        *(undefined4 *)(pPVar9->object + 8) = uVar6;
        local_1a0._0_8_ = (RenderManager *)0x0;
        *(undefined8 *)(pPVar9->object + 0x10) = uVar3;
        local_1a0._8_8_ = (pointer)0x0;
        *(undefined8 *)(pPVar9->object + 0x18) = uVar4;
      }
      UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
      ::ReleaseInDerived((UniqueRenderResource<Rml::Geometry,_Rml::StableVectorIndex,_(Rml::StableVectorIndex)4294967295>
                          *)local_190);
      if ((void *)local_118._24_8_ != (void *)0x0) {
        operator_delete((void *)local_118._24_8_,(long)piStack_f0 - local_118._24_8_);
      }
      if ((pointer)local_118._0_8_ != (pointer)0x0) {
        operator_delete((void *)local_118._0_8_,local_118._16_8_ - local_118._0_8_);
      }
    }
    CompiledShader::Release((CompiledShader *)local_1a0);
  }
  return (DecoratorDataHandle)pPVar9;
}

Assistant:

DecoratorDataHandle DecoratorShader::GenerateElementData(Element* element, BoxArea paint_area) const
{
	RenderManager* render_manager = element->GetRenderManager();
	if (!render_manager)
		return INVALID_DECORATORDATAHANDLE;

	const RenderBox render_box = element->GetRenderBox(paint_area);
	const Vector2f dimensions = render_box.GetFillSize();
	CompiledShader shader = render_manager->CompileShader("shader", Dictionary{{"value", Variant(value)}, {"dimensions", Variant(dimensions)}});
	if (!shader)
		return INVALID_DECORATORDATAHANDLE;

	Mesh mesh;

	const ComputedValues& computed = element->GetComputedValues();
	const byte alpha = byte(computed.opacity() * 255.f);
	MeshUtilities::GenerateBackground(mesh, render_box, ColourbPremultiplied(alpha, alpha));

	const Vector2f offset = render_box.GetFillOffset();
	for (Vertex& vertex : mesh.vertices)
		vertex.tex_coord = (vertex.position - offset) / dimensions;

	ShaderElementData* element_data =
		GetShaderElementDataPool().AllocateAndConstruct(render_manager->MakeGeometry(std::move(mesh)), std::move(shader));

	return reinterpret_cast<DecoratorDataHandle>(element_data);
}